

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.h
# Opt level: O1

shared_ptr<BER_CONTAINER> __thiscall
DynamicStringCallback::buildTypeWithValue(DynamicStringCallback *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar2;
  undefined1 local_41;
  OctetType *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (**(code **)(in_RSI + 0x18))(&local_30);
  local_40 = (OctetType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OctetType,std::allocator<OctetType>,std::__cxx11::string_const>
            (&local_38,&local_40,(allocator<OctetType> *)&local_41,&local_30);
  _Var1._M_pi = local_38._M_pi;
  (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)local_40;
  (this->super_ValueCallback).OID = (SortableOIDType *)0x0;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ValueCallback).OID = (SortableOIDType *)_Var1._M_pi;
  local_40 = (OctetType *)0x0;
  _Var1._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> buildTypeWithValue() override {
      return std::make_shared<OctetType>(m_callback());
    }